

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInput.cpp
# Opt level: O0

int16_t gr::swapb(int16_t snArg)

{
  short snRet;
  short b2;
  short b1;
  int16_t snArg_local;
  
  return (ushort)snArg >> 8 | snArg << 8;
}

Assistant:

int16_t swapb(int16_t snArg)
{
#if WORDS_BIGENDIAN
return snArg;
#else
	short b1, b2;
	b1 = ((snArg & 0xFF00) >> 8)     & 0x00FF;		// remove sign extension
	b2 = ((snArg & 0x00FF) << 8); // & 0xFF00;
	short snRet = b1 | b2;
	return snRet;
#endif
}